

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.cc
# Opt level: O2

void __thiscall
Vector::resize(Vector *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *ptr,
              size_t new_size)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  char cVar4;
  long lVar5;
  ulong uVar6;
  runtime_error *this_00;
  size_t i_2;
  ulong uVar7;
  size_t i;
  ulong uVar8;
  size_t i_1;
  ulong __new_size;
  ulong uVar9;
  MemoryLayout *pMVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  ulong local_80;
  size_t local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  Typelib::Indirect::getIndirection();
  Typelib::Indirect::getIndirection();
  lVar5 = Typelib::Type::getSize();
  uVar7 = (long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start;
  uVar6 = (**(code **)(*(long *)this + 200))(this,ptr);
  if ((this->element_layout).ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->element_layout).ops.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    Typelib::Type::getName_abi_cxx11_();
    std::operator+(&local_50,"could not compute layout for element type ",&local_70);
    std::operator+(&local_a8,&local_50,", cannot copy");
    std::runtime_error::runtime_error(this_00,(string *)&local_a8);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  __new_size = lVar5 * new_size;
  pMVar10 = &this->element_layout;
  cVar4 = Typelib::MemoryLayout::isMemcpy();
  if (cVar4 == '\0') {
    uVar8 = __new_size;
    local_78 = new_size;
    if (new_size < uVar6) {
      for (; uVar8 < uVar7; uVar8 = uVar8 + lVar5) {
        Typelib::destroy((ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar8,pMVar10);
      }
    }
    if ((ulong)((long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)(ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start) < __new_size) {
      local_a8._M_dataplus._M_p = (pointer)0x0;
      local_a8._M_string_length = 0;
      local_a8.field_2._M_allocated_capacity = 0;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8,__new_size);
      uVar8 = uVar7;
      if (__new_size < uVar7) {
        uVar8 = __new_size;
      }
      local_80 = __new_size;
      for (uVar9 = 0; uVar9 < uVar8; uVar9 = uVar9 + lVar5) {
        Typelib::init((uchar *)(local_a8._M_dataplus._M_p + uVar9),pMVar10);
        Typelib::copy(local_a8._M_dataplus._M_p + uVar9,
                      (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + uVar9,pMVar10);
        Typelib::destroy((ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                         _M_impl.super__Vector_impl_data._M_start + uVar9,pMVar10);
      }
      puVar1 = (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)local_a8.field_2._M_allocated_capacity;
      puVar2 = (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)local_a8._M_dataplus._M_p;
      (ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)local_a8._M_string_length;
      local_a8._M_dataplus._M_p = (pointer)puVar2;
      local_a8._M_string_length = (size_type)puVar3;
      local_a8.field_2._M_allocated_capacity = (size_type)puVar1;
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&local_a8);
      __new_size = local_80;
    }
    else {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(ptr,__new_size);
    }
    if (uVar6 < local_78) {
      for (; uVar7 < __new_size; uVar7 = uVar7 + lVar5) {
        Typelib::init((ptr->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start + uVar7,pMVar10);
      }
    }
    return;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(ptr,__new_size);
  return;
}

Assistant:

void Vector::resize(std::vector<uint8_t>* ptr, size_t new_size) const
{
    Type const& element_t = getIndirection();
    size_t element_size = getIndirection().getSize();

    size_t old_raw_size   = ptr->size();
    size_t old_size       = getElementCount(ptr);
    size_t new_raw_size   = new_size * element_size;

    if (!hasElementLayout())
        throw std::runtime_error("could not compute layout for element type " + element_t.getName() + ", cannot copy");

    if (isElementMemcpy())
    {
        ptr->resize(new_raw_size);
        return;
    }


    if (old_size > new_size)
    {
        // Need to destroy the elements that are at the end of the container
        for (size_t i = new_raw_size; i < old_raw_size; i += element_size)
            Typelib::destroy(&(*ptr)[i], element_layout);
    }


    if (ptr->capacity() >= new_raw_size)
        ptr->resize(new_raw_size);
    else
    {
        std::vector<uint8_t> new_buffer;
        new_buffer.resize(new_raw_size);
        size_t copy_raw_size = std::min(old_raw_size, new_raw_size);
        for (size_t i = 0; i < copy_raw_size; i += element_size)
        {
            Typelib::init(&new_buffer[i], element_layout);
            Typelib::copy(&new_buffer[i], &(*ptr)[i], element_layout);
            Typelib::destroy(&(*ptr)[i], element_layout);
        }
        ptr->swap(new_buffer);
    }

    if (old_size < new_size)
    {
        // Need to initialize the new elements at the end of the container
        for (size_t i = old_raw_size; i < new_raw_size; i += element_size)
            Typelib::init(&(*ptr)[i], element_layout);
    }
}